

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChEnumMapper<chrono::ChTimestepper::Type>::AddMapping
          (ChEnumMapper<chrono::ChTimestepper::Type> *this,char *name,Type enumid)

{
  ChEnumNamePair<chrono::ChTimestepper::Type> mpair;
  ChEnumNamePair<chrono::ChTimestepper::Type> CStack_38;
  
  ChEnumNamePair<chrono::ChTimestepper::Type>::ChEnumNamePair(&CStack_38,name,enumid);
  std::
  vector<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>_>_>
  ::push_back((this->enummap).
              super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepper::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr,&CStack_38);
  std::__cxx11::string::~string((string *)&CStack_38);
  return;
}

Assistant:

void AddMapping(const char* name, Te enumid) {
        ChEnumNamePair<Te> mpair (name, enumid);
        enummap->push_back(mpair);
    }